

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.h
# Opt level: O3

void __thiscall hwnet::Poller::~Poller(Poller *this)

{
  ThreadPool *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  
  if (this->poolCreateByNew == true) {
    this_00 = this->pool_;
    if (this_00 != (ThreadPool *)0x0) {
      ThreadPool::~ThreadPool(this_00);
    }
    operator_delete(this_00,0xe0);
  }
  util::TimerRoutine::~TimerRoutine(&this->timerRoutine);
  std::__cxx11::
  _List_base<std::shared_ptr<hwnet::Channel>,_std::allocator<std::shared_ptr<hwnet::Channel>_>_>::
  _M_clear(&(this->waitRemove).
            super__List_base<std::shared_ptr<hwnet::Channel>,_std::allocator<std::shared_ptr<hwnet::Channel>_>_>
          );
  this_01 = (this->notifyChannel_).
            super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  Epoll::~Epoll(&this->poller_);
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->channels)._M_h);
  return;
}

Assistant:

~Poller() {
		if(this->poolCreateByNew){
			delete this->pool_;
		}
	}